

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_comp.c
# Opt level: O0

int avl_comp_uint32(void *k1,void *k2)

{
  uint32_t *u2;
  uint32_t *u1;
  void *k2_local;
  void *k1_local;
  
  if (*k2 < *k1) {
    k1_local._4_4_ = 1;
  }
  else if (*k1 < *k2) {
    k1_local._4_4_ = -1;
  }
  else {
    k1_local._4_4_ = 0;
  }
  return k1_local._4_4_;
}

Assistant:

int
avl_comp_uint32(const void *k1, const void *k2) {
  const uint32_t *u1 = k1;
  const uint32_t *u2 = k2;

  if (*u1 > *u2) {
    return 1;
  }
  if (*u2 > *u1) {
    return -1;
  }
  return 0;
}